

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O2

void recvtftp(testcase *test,formats *pf)

{
  ssize_t sVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  tftphdr_storage_t *handler;
  int iVar5;
  char *msg;
  int iVar6;
  unsigned_short recvblock;
  tftphdr *rdp;
  
  recvblock = 0;
  prevchar = -1;
  current = 0;
  newline = 0;
  nextone = 0;
  bfs[0].counter = -3;
  bfs[1].counter = -2;
  rdp = (tftphdr *)&bfs[0].buf;
  mysignal(0x105f68,(_func_void_int *)pf);
LAB_00105a0c:
  timeout = 0;
  ackbuf.hdr.th_opcode = 0x400;
  ackbuf._2_2_ = recvblock << 8 | recvblock >> 8;
  recvblock = recvblock + 1;
  __sigsetjmp(timeoutbuf,1);
  do {
    sVar1 = send(peer,&ackbuf,4,0x4000);
    if (sVar1 != 4) {
      msg = "write: fail\n";
LAB_00105c8d:
      logmsg(msg);
      return;
    }
    write_behind(test,pf->f_convert);
    do {
      do {
        alarm(5);
        uVar2 = recv(peer,rdp,0x204,0);
        alarm(0);
        if (got_exit_signal != 0) {
          return;
        }
        if ((long)uVar2 < 0) {
          msg = "read: fail\n";
          goto LAB_00105c8d;
        }
        rdp->th_opcode = rdp->th_opcode << 8 | (ushort)rdp->th_opcode >> 8;
        (rdp->th_u1).th_u2.th_u3.tu_block =
             *(ushort *)&rdp->th_u1 << 8 | *(ushort *)&rdp->th_u1 >> 8;
        if (rdp->th_opcode == 5) {
          return;
        }
      } while (rdp->th_opcode != 3);
      if ((rdp->th_u1).th_u2.th_u3.tu_block == recvblock) {
        iVar6 = (int)uVar2 + -4;
        iVar5 = pf->f_convert;
        uVar3 = (ulong)(uint)current;
        bfs[uVar3].counter = iVar6;
        current = (int)(uVar3 == 0);
        if (bfs[uVar3 == 0].counter != -2) {
          write_behind(test,iVar5);
        }
        uVar3 = (ulong)(uint)current;
        rdp = (tftphdr *)&bfs[uVar3].buf;
        bfs[uVar3].counter = -3;
        if (0x20000000 < uVar2 >> 2) {
          if (iVar6 < 0) {
            piVar4 = __errno_location();
            iVar5 = *piVar4 + 100;
          }
          else {
            iVar5 = 3;
          }
          nak(iVar5);
          return;
        }
        if (iVar6 != 0x200) {
          write_behind(test,pf->f_convert);
          ackbuf.hdr.th_opcode = 0x400;
          handler = &ackbuf;
          ackbuf._2_2_ = recvblock * 0x100 | recvblock >> 8;
          send(peer,&ackbuf,4,0x4000);
          mysignal(0x106194,(_func_void_int *)handler->storage);
          alarm(5);
          sVar1 = recv(peer,&buf,0x204,0);
          alarm(0);
          if (got_exit_signal != 0) {
            return;
          }
          if (sVar1 < 4) {
            return;
          }
          if (rdp->th_opcode != 3) {
            return;
          }
          if (recvblock != *(ushort *)((long)&bfs[uVar3].buf + 2)) {
            return;
          }
          send(peer,&ackbuf,4,0x4000);
          return;
        }
        goto LAB_00105a0c;
      }
      synchnet(peer);
    } while (recvblock - 1 != (uint)(rdp->th_u1).th_u2.th_u3.tu_block);
  } while( true );
}

Assistant:

static void recvtftp(struct testcase *test, struct formats *pf)
{
  ssize_t n, size;
  /* These are volatile to live through a siglongjmp */
  volatile unsigned short recvblock; /* block count */
  struct tftphdr * volatile rdp;     /* data buffer */
  struct tftphdr *rap;      /* ack buffer */

  recvblock = 0;
  rdp = w_init();
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, timer);
#endif
  rap = &ackbuf.hdr;
  do {
    timeout = 0;
    rap->th_opcode = htons((unsigned short)opcode_ACK);
    rap->th_block = htons(recvblock);
    recvblock++;
#ifdef HAVE_SIGSETJMP
    (void) sigsetjmp(timeoutbuf, 1);
#endif
send_ack:
    if(swrite(peer, &ackbuf.storage[0], 4) != 4) {
      logmsg("write: fail\n");
      goto abort;
    }
    write_behind(test, pf->f_convert);
    for(;;) {
#ifdef HAVE_ALARM
      alarm(rexmtval);
#endif
      n = sread(peer, rdp, PKTSIZE);
#ifdef HAVE_ALARM
      alarm(0);
#endif
      if(got_exit_signal)
        goto abort;
      if(n < 0) {                       /* really? */
        logmsg("read: fail\n");
        goto abort;
      }
      rdp->th_opcode = ntohs((unsigned short)rdp->th_opcode);
      rdp->th_block = ntohs(rdp->th_block);
      if(rdp->th_opcode == opcode_ERROR)
        goto abort;
      if(rdp->th_opcode == opcode_DATA) {
        if(rdp->th_block == recvblock) {
          break;                         /* normal */
        }
        /* Re-synchronize with the other side */
        (void) synchnet(peer);
        if(rdp->th_block == (recvblock-1))
          goto send_ack;                 /* rexmit */
      }
    }

    size = writeit(test, &rdp, (int)(n - 4), pf->f_convert);
    if(size != (n-4)) {                 /* ahem */
      if(size < 0)
        nak(errno + 100);
      else
        nak(ENOSPACE);
      goto abort;
    }
  } while(size == SEGSIZE);
  write_behind(test, pf->f_convert);

  rap->th_opcode = htons((unsigned short)opcode_ACK);  /* send the "final"
                                                          ack */
  rap->th_block = htons(recvblock);
  (void) swrite(peer, &ackbuf.storage[0], 4);
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, justtimeout);        /* just abort read on timeout */
  alarm(rexmtval);
#endif
  /* normally times out and quits */
  n = sread(peer, &buf.storage[0], sizeof(buf.storage));
#ifdef HAVE_ALARM
  alarm(0);
#endif
  if(got_exit_signal)
    goto abort;
  if(n >= 4 &&                               /* if read some data */
     rdp->th_opcode == opcode_DATA &&        /* and got a data block */
     recvblock == rdp->th_block) {           /* then my last ack was lost */
    (void) swrite(peer, &ackbuf.storage[0], 4);  /* resend final ack */
  }
abort:
  return;
}